

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.cpp
# Opt level: O0

NameList * __thiscall
libcellml::findComponentCnUnitsNames_abi_cxx11_
          (NameList *__return_storage_ptr__,libcellml *this,ComponentConstPtr *component)

{
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *this_00;
  bool bVar1;
  element_type *this_01;
  ulong uVar2;
  element_type *this_02;
  size_type __n;
  iterator __first;
  iterator __last;
  iterator __result;
  XmlNodePtr *node;
  allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_f2;
  undefined1 local_f1;
  UniqueNames local_f0;
  undefined1 local_c0 [8];
  XmlNodePtr rootNode;
  shared_ptr<libcellml::XmlDoc> *doc;
  iterator __end1;
  iterator __begin1;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  *__range1;
  vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
  mathDocs;
  undefined1 local_68 [8];
  string mathContent;
  UniqueNames nodeUnitsNames;
  ComponentConstPtr *component_local;
  NameList *unitsNames;
  
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         *)((long)&mathContent.field_2 + 8));
  this_01 = std::
            __shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
            ::operator->((__shared_ptr_access<const_libcellml::Component,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                          *)this);
  Component::math_abi_cxx11_((string *)local_68,this_01);
  uVar2 = std::__cxx11::string::empty();
  if ((uVar2 & 1) == 0) {
    multiRootXml((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                  *)&__range1,(string *)local_68);
    __end1 = std::
             vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
             ::begin((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                      *)&__range1);
    doc = (shared_ptr<libcellml::XmlDoc> *)
          std::
          vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
          ::end((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
                 *)&__range1);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
                                       *)&doc), bVar1) {
      rootNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
           = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
             __gnu_cxx::
             __normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
             ::operator*(&__end1);
      std::__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
      operator->((__shared_ptr_access<libcellml::XmlDoc,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                 )rootNode.super___shared_ptr<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2>.
                  _M_refcount._M_pi);
      XmlDoc::rootNode((XmlDoc *)local_c0);
      this_02 = std::
                __shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                operator->((__shared_ptr_access<libcellml::XmlNode,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)local_c0);
      bVar1 = XmlNode::isMathmlElement(this_02,"math");
      if (bVar1) {
        findCnUnitsNames_abi_cxx11_(&local_f0,(libcellml *)local_c0,node);
        std::
        set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
        ::merge<std::less<std::__cxx11::string>>
                  ((set<std::__cxx11::string,std::less<std::__cxx11::string>,std::allocator<std::__cxx11::string>>
                    *)(mathContent.field_2._M_local_buf + 8),&local_f0);
        std::
        set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::~set(&local_f0);
      }
      std::shared_ptr<libcellml::XmlNode>::~shared_ptr((shared_ptr<libcellml::XmlNode> *)local_c0);
      __gnu_cxx::
      __normal_iterator<std::shared_ptr<libcellml::XmlDoc>_*,_std::vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>_>
      ::operator++(&__end1);
    }
    local_f1 = 0;
    __n = std::
          set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::size((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)((long)&mathContent.field_2 + 8));
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::allocator(&local_f2);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__,__n,&local_f2);
    std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::~allocator(&local_f2);
    this_00 = (set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)((long)&mathContent.field_2 + 8);
    __first = std::
              set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::begin(this_00);
    __last = std::
             set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(this_00);
    __result = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin(__return_storage_ptr__);
    std::
    copy<std::_Rb_tree_const_iterator<std::__cxx11::string>,__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
              ((_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__first._M_node,
               (_Rb_tree_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                )__last._M_node,
               (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                )__result._M_current);
    mathDocs.
    super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
    local_f1 = 1;
    std::
    vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ::~vector((vector<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
               *)&__range1);
  }
  else {
    memset(__return_storage_ptr__,0,0x18);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::vector(__return_storage_ptr__);
    mathDocs.
    super__Vector_base<std::shared_ptr<libcellml::XmlDoc>,_std::allocator<std::shared_ptr<libcellml::XmlDoc>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage._0_4_ = 1;
  }
  std::__cxx11::string::~string((string *)local_68);
  std::
  set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~set((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *)((long)&mathContent.field_2 + 8));
  return __return_storage_ptr__;
}

Assistant:

NameList findComponentCnUnitsNames(const ComponentConstPtr &component)
{
    UniqueNames nodeUnitsNames;
    // Inspect the MathML in this component for any specified constant <cn> units.
    std::string mathContent = component->math();
    if (mathContent.empty()) {
        return {};
    }
    std::vector<XmlDocPtr> mathDocs = multiRootXml(mathContent);
    for (const auto &doc : mathDocs) {
        auto rootNode = doc->rootNode();
        if (rootNode->isMathmlElement("math")) {
            nodeUnitsNames.merge(findCnUnitsNames(rootNode));
        }
    }

    NameList unitsNames(nodeUnitsNames.size());
    std::copy(nodeUnitsNames.begin(), nodeUnitsNames.end(), unitsNames.begin());
    return unitsNames;
}